

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * __thiscall
kj::_::Delimited<kj::Repeat<kj::StringPtr>_>::flattenTo
          (Delimited<kj::Repeat<kj::StringPtr>_> *this,char *target)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *elem;
  ArrayPtr<const_char> *__end0;
  ArrayPtr<const_char> *__begin0;
  Array<kj::ArrayPtr<const_char>_> *__range3;
  char *pcStack_18;
  bool first;
  char *target_local;
  Delimited<kj::Repeat<kj::StringPtr>_> *this_local;
  
  ensureStringifiedInitialized(this);
  bVar1 = true;
  __end0 = Array<kj::ArrayPtr<const_char>_>::begin(&this->stringified);
  pAVar2 = Array<kj::ArrayPtr<const_char>_>::end(&this->stringified);
  pcStack_18 = target;
  for (; __end0 != pAVar2; __end0 = __end0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pcStack_18 = fill<kj::StringPtr>(pcStack_18,&this->delimiter);
    }
    pcStack_18 = fill<kj::ArrayPtr<char_const>>(pcStack_18,__end0);
  }
  return pcStack_18;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }